

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O3

bool __thiscall
google::protobuf::MessageLite::AppendPartialToString(MessageLite *this,string *output)

{
  size_type sVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  LogMessage *pLVar3;
  size_t bytes_produced_by_serialization;
  pointer pcVar4;
  LogFinisher local_59;
  LogMessage local_58;
  ulong value;
  
  sVar1 = output->_M_string_length;
  iVar2 = (*this->_vptr_MessageLite[0xc])();
  value = CONCAT44(extraout_var,iVar2);
  if ((value & 0xffffffff80000000) == 0) {
    std::__cxx11::string::resize((ulong)output,(char)iVar2 + (char)sVar1);
    pcVar4 = (output->_M_dataplus)._M_p + sVar1;
    iVar2 = (*this->_vptr_MessageLite[0xe])(this,pcVar4);
    bytes_produced_by_serialization = CONCAT44(extraout_var_00,iVar2) - (long)pcVar4;
    if (bytes_produced_by_serialization != value) {
      iVar2 = (*this->_vptr_MessageLite[0xc])(this);
      anon_unknown_12::ByteSizeConsistencyError
                (value,CONCAT44(extraout_var_01,iVar2),bytes_produced_by_serialization,this);
    }
  }
  else {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x12e);
    pLVar3 = internal::LogMessage::operator<<(&local_58,"Exceeded maximum protobuf size of 2GB: ");
    pLVar3 = internal::LogMessage::operator<<(pLVar3,value);
    internal::LogFinisher::operator=(&local_59,pLVar3);
    internal::LogMessage::~LogMessage(&local_58);
  }
  return value >> 0x1f == 0;
}

Assistant:

bool MessageLite::AppendPartialToString(string* output) const {
  size_t old_size = output->size();
  size_t byte_size = ByteSizeLong();
  if (byte_size > INT_MAX) {
    GOOGLE_LOG(ERROR) << "Exceeded maximum protobuf size of 2GB: " << byte_size;
    return false;
  }

  STLStringResizeUninitialized(output, old_size + byte_size);
  uint8* start =
      reinterpret_cast<uint8*>(io::mutable_string_data(output) + old_size);
  uint8* end = SerializeWithCachedSizesToArray(start);
  if (end - start != byte_size) {
    ByteSizeConsistencyError(byte_size, ByteSizeLong(), end - start, *this);
  }
  return true;
}